

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O1

void test_new_delete(char *dir,char *file,vmemcache_repl_p repl_p)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint extraout_EAX;
  char *__s1;
  char *__s1_00;
  size_t sVar6;
  VMEMcache *pVVar7;
  long lVar8;
  int *piVar9;
  VMEMcache *pVVar10;
  VMEMcache *cache;
  void *pvVar11;
  size_t sVar12;
  undefined8 extraout_RAX;
  void *__dest;
  uint __seed;
  undefined8 uVar13;
  ulong extraout_RDX;
  char *pcVar14;
  undefined4 uVar15;
  ulong uVar16;
  stat_t sVar17;
  undefined *puVar18;
  void *__src;
  void *pvVar19;
  size_t unaff_R13;
  ulong *puVar20;
  ulong *puVar21;
  ulong *puVar22;
  char *pcVar23;
  undefined **ppuVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  char acStack_18d8 [24];
  undefined8 uStack_18c0;
  undefined1 auStack_18b8 [64];
  undefined1 auStack_1878 [32];
  undefined1 auStack_1858 [16];
  undefined1 *apuStack_1848 [2];
  long alStack_1838 [2];
  undefined1 *puStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined1 *puStack_1808;
  undefined8 uStack_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined1 *puStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined1 *puStack_17c8;
  undefined8 uStack_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined1 *puStack_17a8;
  undefined8 uStack_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined1 *puStack_1788;
  undefined8 uStack_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined1 *puStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined1 *puStack_1748;
  undefined8 uStack_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined1 *puStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined1 *puStack_1708;
  undefined8 uStack_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined1 *puStack_16e8;
  undefined8 uStack_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined1 *puStack_16c8;
  undefined8 uStack_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined1 *puStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined1 *puStack_1688;
  undefined8 uStack_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined1 *puStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  long lStack_1640;
  char *pcStack_1638;
  VMEMcache *pVStack_1630;
  char *pcStack_1628;
  size_t sStack_1620;
  char *pcStack_1618;
  VMEMcache *pVStack_1610;
  code *pcStack_1608;
  VMEMcache *pVStack_1600;
  char *pcStack_15f8;
  ulong *puStack_15f0;
  VMEMcache *pVStack_15e8;
  code *pcStack_15e0;
  size_t *in_stack_ffffffffffffea28;
  stat_t in_stack_ffffffffffffea30;
  stat_t in_stack_ffffffffffffea38;
  size_t sStack_11c0;
  int iStack_11b4;
  ulong uStack_11b0;
  ulong uStack_11a8;
  VMEMcache *pVStack_11a0;
  char *pcStack_1198;
  code *pcStack_1178;
  long *plStack_1170;
  char acStack_1160 [264];
  long lStack_1058;
  long lStack_1050;
  char *pcStack_1048;
  char *pcStack_1040;
  char *pcStack_1038;
  code *pcStack_1030;
  char local_1028 [8];
  char nonexistent [4096];
  long lVar26;
  
  pcVar23 = (char *)(ulong)repl_p;
  pcStack_1030 = (code *)0x105a74;
  __s1 = (char *)vmemcache_new();
  pcStack_1030 = (code *)0x105a84;
  vmemcache_set_size(__s1,0x100000);
  pcStack_1030 = (code *)0x105a91;
  vmemcache_set_extent_size(__s1,0x100);
  pcStack_1030 = (code *)0x105a9c;
  vmemcache_set_eviction_policy(__s1,pcVar23);
  pcStack_1030 = (code *)0x105aa7;
  pcVar14 = dir;
  __s1_00 = __s1;
  iVar2 = vmemcache_add();
  iVar4 = (int)pcVar14;
  if (iVar2 == 0) {
    pcStack_1030 = (code *)0x105ab7;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105abc;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105acc;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105ad9;
    vmemcache_set_extent_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105ae4;
    vmemcache_set_eviction_policy(__s1,repl_p);
    pcStack_1030 = (code *)0x105aef;
    pcVar14 = dir;
    __s1_00 = __s1;
    iVar2 = vmemcache_add();
    iVar4 = (int)pcVar14;
    if (iVar2 != 0) goto LAB_00105d8f;
    pcStack_1030 = (code *)0x105aff;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b04;
    __s1 = (char *)vmemcache_new();
    iVar4 = 1;
    pcStack_1030 = (code *)0x105b14;
    __s1_00 = __s1;
    iVar2 = vmemcache_set_extent_size();
    if (iVar2 == 0) goto LAB_00105d94;
    pcStack_1030 = (code *)0x105b24;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b29;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105b39;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105b48;
    iVar2 = vmemcache_set_extent_size(__s1,0xffffffffffffffff);
    if (iVar2 == 0) {
      pcStack_1030 = (code *)0x105b57;
      pcVar14 = dir;
      __s1_00 = __s1;
      iVar2 = vmemcache_add();
      iVar4 = (int)pcVar14;
      if (iVar2 != 0) goto LAB_00105b5f;
      goto LAB_00105dc6;
    }
LAB_00105b5f:
    pcStack_1030 = (code *)0x105b67;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b6c;
    __s1 = (char *)vmemcache_new();
    iVar4 = 0xff;
    pcStack_1030 = (code *)0x105b7c;
    __s1_00 = __s1;
    iVar2 = vmemcache_set_extent_size();
    if (iVar2 == 0) goto LAB_00105d99;
    pcStack_1030 = (code *)0x105b8c;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b91;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105ba1;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105bae;
    iVar2 = vmemcache_set_extent_size(__s1,0x100001);
    if (iVar2 != 0) {
LAB_00105bc5:
      pcStack_1030 = (code *)0x105bcd;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105bd2;
      __s1 = (char *)vmemcache_new();
      iVar4 = 0xfffff;
      pcStack_1030 = (code *)0x105be2;
      __s1_00 = __s1;
      iVar2 = vmemcache_set_size();
      if (iVar2 == 0) goto LAB_00105d9e;
      pcStack_1030 = (code *)0x105bf2;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105bf7;
      __s1 = (char *)vmemcache_new();
      iVar4 = 1;
      pcStack_1030 = (code *)0x105c07;
      __s1_00 = __s1;
      iVar2 = vmemcache_set_size();
      if (iVar2 == 0) goto LAB_00105da3;
      pcStack_1030 = (code *)0x105c17;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105c1c;
      __s1 = (char *)vmemcache_new();
      iVar4 = -1;
      pcStack_1030 = (code *)0x105c2e;
      __s1_00 = __s1;
      iVar2 = vmemcache_set_size();
      if (iVar2 == 0) goto LAB_00105da8;
      pcStack_1030 = (code *)0x105c3e;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105c43;
      __s1 = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105c53;
      vmemcache_set_size(__s1,0x100000);
      pcStack_1030 = (code *)0x105c60;
      vmemcache_set_extent_size(__s1,0x100);
      pcStack_1030 = (code *)0x105c6b;
      vmemcache_set_eviction_policy(__s1,pcVar23);
      pcStack_1030 = (code *)0x105c76;
      pcVar14 = file;
      __s1_00 = __s1;
      iVar2 = vmemcache_add();
      iVar4 = (int)pcVar14;
      if (iVar2 == 0) goto LAB_00105dad;
      pcStack_1030 = (code *)0x105c83;
      __s1_00 = (char *)vmemcache_errormsg();
      iVar4 = 0x1083e3;
      pcStack_1030 = (code *)0x105c92;
      iVar2 = strcmp(__s1_00,"open: Not a directory");
      if (iVar2 != 0) goto LAB_00105db2;
      pcStack_1030 = (code *)0x105ca2;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105ca7;
      file = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105cb7;
      vmemcache_set_size(file,0x100000);
      pcStack_1030 = (code *)0x105cc4;
      vmemcache_set_extent_size(file,0x100);
      pcStack_1030 = (code *)0x105ccf;
      vmemcache_set_eviction_policy(file);
      iVar4 = 0;
      pcStack_1030 = (code *)0x105cd9;
      __s1_00 = file;
      iVar2 = vmemcache_add();
      if (iVar2 == 0) goto LAB_00105db7;
      pcStack_1030 = (code *)0x105ce6;
      __s1_00 = (char *)vmemcache_errormsg();
      iVar4 = 0x10846d;
      pcStack_1030 = (code *)0x105cf5;
      iVar2 = strcmp(__s1_00,"invalid (NULL) path");
      if (iVar2 != 0) goto LAB_00105dbc;
      pcStack_1030 = (code *)0x105d05;
      vmemcache_delete(file);
      pcStack_1030 = (code *)0x105d0a;
      file = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105d1a;
      vmemcache_set_size(file,0x100000);
      pcStack_1030 = (code *)0x105d27;
      vmemcache_set_extent_size(file,0x100);
      pcStack_1030 = (code *)0x105d32;
      vmemcache_set_eviction_policy(file,repl_p);
      pcVar23 = local_1028;
      pcStack_1030 = (code *)0x105d44;
      strcpy(pcVar23,dir);
      pcStack_1030 = (code *)0x105d4c;
      sVar6 = strlen(pcVar23);
      builtin_strncpy(local_1028 + sVar6,"/nonexis",8);
      builtin_strncpy(nonexistent + sVar6,"tent_dir",9);
      pcStack_1030 = (code *)0x105d6e;
      pcVar14 = pcVar23;
      __s1_00 = file;
      iVar2 = vmemcache_add();
      iVar4 = (int)pcVar14;
      if (iVar2 != 0) {
        pcStack_1030 = (code *)0x105d7a;
        vmemcache_delete(file);
        return;
      }
      goto LAB_00105dc1;
    }
    pcStack_1030 = (code *)0x105bbd;
    pcVar14 = dir;
    __s1_00 = __s1;
    iVar2 = vmemcache_add();
    iVar4 = (int)pcVar14;
    if (iVar2 != 0) goto LAB_00105bc5;
  }
  else {
    pcStack_1030 = (code *)0x105d8f;
    test_new_delete_cold_1();
LAB_00105d8f:
    pcStack_1030 = (code *)0x105d94;
    test_new_delete_cold_2();
LAB_00105d94:
    pcStack_1030 = (code *)0x105d99;
    test_new_delete_cold_14();
LAB_00105d99:
    pcStack_1030 = (code *)0x105d9e;
    test_new_delete_cold_12();
LAB_00105d9e:
    pcStack_1030 = (code *)0x105da3;
    test_new_delete_cold_10();
LAB_00105da3:
    pcStack_1030 = (code *)0x105da8;
    test_new_delete_cold_9();
LAB_00105da8:
    pcStack_1030 = (code *)0x105dad;
    test_new_delete_cold_8();
LAB_00105dad:
    pcStack_1030 = (code *)0x105db2;
    test_new_delete_cold_7();
LAB_00105db2:
    pcStack_1030 = (code *)0x105db7;
    test_new_delete_cold_3();
LAB_00105db7:
    pcStack_1030 = (code *)0x105dbc;
    test_new_delete_cold_6();
LAB_00105dbc:
    pcStack_1030 = (code *)0x105dc1;
    test_new_delete_cold_4();
LAB_00105dc1:
    pcStack_1030 = (code *)0x105dc6;
    test_new_delete_cold_5();
LAB_00105dc6:
    pcStack_1030 = (code *)0x105dcb;
    test_new_delete_cold_13();
  }
  pcStack_1030 = test_put_get_evict;
  test_new_delete_cold_11();
  pcStack_1178 = (code *)0x105deb;
  pcStack_1048 = dir;
  pcStack_1040 = pcVar23;
  pcStack_1038 = file;
  pcStack_1030 = (code *)&stack0xfffffffffffffff8;
  pVVar7 = (VMEMcache *)vmemcache_new();
  pcStack_1178 = (code *)0x105dfb;
  vmemcache_set_size(pVVar7,0x100000);
  pcStack_1178 = (code *)0x105e08;
  vmemcache_set_extent_size(pVVar7,0x100);
  pcStack_1178 = (code *)0x105e13;
  vmemcache_set_eviction_policy(pVVar7,iVar4);
  pcStack_1178 = (code *)0x105e1e;
  iVar2 = vmemcache_add(pVVar7,__s1_00);
  if (iVar2 == 0) {
    pcStack_1178 = (code *)0x105e47;
    iVar2 = vmemcache_put(pVVar7,"KEY",4,"VALUE");
    if (iVar2 != 0) goto LAB_00105f94;
    pcStack_1178 = (code *)0x105e5c;
    verify_stat_entries(pVVar7,1);
    lStack_1050 = 0;
    pcStack_1178 = (code *)0x105e7c;
    iVar2 = vmemcache_exists(pVVar7,"KEY",4,&lStack_1058);
    if (iVar2 != 1) goto LAB_00105f99;
    iVar2 = 0x10851e;
    pcStack_1178 = (code *)0x105eb1;
    plStack_1170 = &lStack_1050;
    lVar8 = vmemcache_get(pVVar7,"KEY",4,acStack_1160,0x100,0);
    if (lVar8 < 0) goto LAB_00105fa0;
    if (lStack_1058 != lStack_1050) goto LAB_00105fa5;
    if (lVar8 != 6) goto LAB_00105fb2;
    if (lStack_1050 != 6) goto LAB_00105fba;
    iVar2 = 0x108522;
    pcStack_1178 = (code *)0x105eef;
    iVar3 = strncmp(acStack_1160,"VALUE",6);
    if (iVar3 != 0) goto LAB_00105fc3;
    if (iVar4 == 0) {
      iVar2 = 0x10851e;
      uVar13 = 4;
    }
    else {
      iVar2 = 0;
      uVar13 = 0;
    }
    pcStack_1178 = (code *)0x105f19;
    iVar4 = vmemcache_evict(pVVar7,iVar2,uVar13);
    if (iVar4 == -1) goto LAB_00105fcf;
    pcStack_1178 = (code *)0x105f4a;
    plStack_1170 = &lStack_1050;
    lVar8 = vmemcache_get(pVVar7,"KEY",4,acStack_1160,0x100,0);
    if (lVar8 != -1) {
LAB_00105f8a:
      pcStack_1178 = (code *)0x105f8f;
      test_put_get_evict_cold_8();
      goto LAB_00105f8f;
    }
    pcStack_1178 = (code *)0x105f55;
    piVar9 = __errno_location();
    if (*piVar9 != 2) goto LAB_00105f8a;
    iVar2 = 0x10851e;
    pcStack_1178 = (code *)0x105f70;
    uVar5 = vmemcache_exists(pVVar7,"KEY",4,0);
    if (uVar5 == 0) {
      pcStack_1178 = (code *)0x105f7c;
      vmemcache_delete(pVVar7);
      return;
    }
  }
  else {
LAB_00105f8f:
    pcStack_1178 = (code *)0x105f94;
    test_put_get_evict_cold_1();
LAB_00105f94:
    pcStack_1178 = (code *)0x105f99;
    test_put_get_evict_cold_2();
LAB_00105f99:
    pcStack_1178 = (code *)0x105fa0;
    test_put_get_evict_cold_3();
LAB_00105fa0:
    pcStack_1178 = (code *)0x105fa5;
    test_put_get_evict_cold_11();
LAB_00105fa5:
    iVar2 = (int)&lStack_1050;
    pcStack_1178 = (code *)0x105fb2;
    test_put_get_evict_cold_4();
LAB_00105fb2:
    pcStack_1178 = (code *)0x105fba;
    test_put_get_evict_cold_5();
LAB_00105fba:
    pcStack_1178 = (code *)0x105fc3;
    test_put_get_evict_cold_6();
LAB_00105fc3:
    pcStack_1178 = (code *)0x105fcf;
    test_put_get_evict_cold_7();
LAB_00105fcf:
    pcStack_1178 = (code *)0x105fd4;
    test_put_get_evict_cold_10();
    uVar5 = extraout_EAX;
  }
  puVar20 = (ulong *)(ulong)uVar5;
  pcStack_1178 = test_memory_leaks;
  test_put_get_evict_cold_9();
  pcStack_15e0 = (code *)0x105ffc;
  iStack_11b4 = iVar2;
  pVStack_11a0 = pVVar7;
  pcStack_1198 = __s1;
  pcStack_1178 = (code *)&pcStack_1030;
  srand(__seed);
  uStack_11a8 = 0;
  uStack_11b0 = 0;
  pcStack_15e0 = (code *)0x10600b;
  pVVar10 = (VMEMcache *)vmemcache_new();
  pcStack_15e0 = (code *)0x10601b;
  vmemcache_set_size(pVVar10,0x100000);
  pcStack_15e0 = (code *)0x106028;
  vmemcache_set_extent_size(pVVar10,0x100);
  pcStack_15e0 = (code *)0x106035;
  vmemcache_set_eviction_policy(pVVar10,1);
  pcStack_15e0 = (code *)0x106040;
  puVar22 = puVar20;
  ppuVar24 = (undefined **)pVVar10;
  iVar2 = vmemcache_add();
  uVar5 = (uint)puVar22;
  if (iVar2 == 0) {
    pcStack_15e0 = (code *)0x10605e;
    vmemcache_callback_on_evict(pVVar10,on_evict_test_memory_leaks_cb,&uStack_11b0);
    puVar22 = (ulong *)0x0;
    pcVar23 = __s1;
    while (uStack_11b0 < 1000) {
      pcStack_15e0 = (code *)0x106079;
      iVar2 = rand();
      puVar20 = (ulong *)(long)iVar2;
      pVVar7 = (VMEMcache *)(((ulong)puVar20 / 0xff81) * 0xff81);
      unaff_R13 = (ulong)puVar20 % 0xff81 + 0x80;
      pcStack_15e0 = (code *)0x1060b0;
      __s1 = (char *)malloc(unaff_R13);
      if (__s1 == (char *)0x0) {
LAB_00106239:
        __s1 = pcVar23;
        pcStack_15e0 = (code *)0x10623e;
        test_memory_leaks_cold_9();
        puVar21 = puVar20;
LAB_0010623e:
        puVar20 = puVar21;
        pcStack_15e0 = (code *)0x106243;
        test_memory_leaks_cold_8();
LAB_00106243:
        pcStack_15e0 = (code *)0x10624e;
        test_memory_leaks_cold_5();
LAB_0010624e:
        pcStack_15e0 = (code *)0x10625a;
        test_memory_leaks_cold_4();
LAB_0010625a:
        pcStack_15e0 = (code *)0x106265;
        test_memory_leaks_cold_3();
LAB_00106265:
        ppuVar24 = (undefined **)&uStack_11a8;
        uVar5 = (uint)&uStack_11b0;
        pcStack_15e0 = (code *)0x106272;
        test_memory_leaks_cold_2();
        goto LAB_00106272;
      }
      puVar21 = (ulong *)((ulong)puVar20 % 0xff81);
      pcStack_15e0 = (code *)0x1060d0;
      memset(__s1,0x2a,(size_t)((long)puVar21 + 0x7f));
      (__s1 + 0x7f)[(long)puVar21] = '\0';
      if (iStack_11b4 == 0) {
        uVar13 = 8;
        puVar20 = &uStack_11a8;
      }
      else {
        puVar20 = (ulong *)&stack0xffffffffffffea30;
        pcStack_15e0 = (code *)0x1060f5;
        memset(puVar20,0x2a,0x400);
        uVar13 = 0x408;
        puVar21 = puVar20;
      }
      pcStack_15e0 = (code *)0x106121;
      iVar2 = vmemcache_put(pVVar10,puVar20,uVar13,__s1,unaff_R13);
      puVar20 = puVar21;
      if (iVar2 != 0) goto LAB_00106265;
      pcStack_15e0 = (code *)0x106131;
      puVar20 = (ulong *)malloc(unaff_R13);
      if (puVar20 == (ulong *)0x0) goto LAB_0010623e;
      if (iStack_11b4 == 0) {
        uVar13 = 8;
        puVar21 = &uStack_11a8;
      }
      else {
        uVar13 = 0x408;
        puVar21 = (ulong *)&stack0xffffffffffffea30;
      }
      in_stack_ffffffffffffea28 = &sStack_11c0;
      pcStack_15e0 = (code *)0x10617e;
      sVar6 = vmemcache_get(pVVar10,puVar21,uVar13,puVar20,unaff_R13,0);
      pcVar23 = __s1;
      if ((long)sVar6 < 0) {
        pcStack_15e0 = (code *)0x106239;
        test_memory_leaks_cold_7();
        goto LAB_00106239;
      }
      if (sVar6 != unaff_R13) goto LAB_0010625a;
      if (unaff_R13 != sStack_11c0) goto LAB_0010624e;
      pcStack_15e0 = (code *)0x1061a5;
      iVar2 = strcmp(__s1,(char *)puVar20);
      if (iVar2 != 0) goto LAB_00106243;
      pcStack_15e0 = (code *)0x1061b5;
      free(__s1);
      pcStack_15e0 = (code *)0x1061bd;
      free(puVar20);
      uStack_11a8 = uStack_11a8 + 1;
      puVar22 = (ulong *)((long)puVar22 + 1);
    }
    pcStack_15e0 = (code *)0x1061e7;
    verify_stat_entries(pVVar10,uStack_11a8 - uStack_11b0);
    do {
      pcStack_15e0 = (code *)0x1061f3;
      iVar2 = vmemcache_evict(pVVar10,0,0);
    } while (iVar2 == 0);
    pcStack_15e0 = (code *)0x106210;
    uVar16 = uStack_11a8;
    verify_stats(pVVar10,uStack_11a8,(stat_t)puVar22,(stat_t)puVar22,0,uStack_11b0,
                 (stat_t)in_stack_ffffffffffffea28,in_stack_ffffffffffffea30,
                 in_stack_ffffffffffffea38);
    uVar5 = (uint)uVar16;
    pcStack_15e0 = (code *)0x106218;
    ppuVar24 = (undefined **)pVVar10;
    vmemcache_delete();
    __s1 = pcVar23;
    puVar20 = puVar22;
    if (uStack_11b0 == uStack_11a8) {
      return;
    }
  }
  else {
LAB_00106272:
    pcStack_15e0 = (code *)0x106277;
    test_memory_leaks_cold_1();
  }
  pcStack_15e0 = test_merge_allocations;
  test_memory_leaks_cold_6();
  pcVar23 = (char *)(ulong)uVar5;
  pcStack_1608 = (code *)0x106292;
  pVStack_1600 = pVVar7;
  pcStack_15f8 = __s1;
  puStack_15f0 = puVar20;
  pVStack_15e8 = pVVar10;
  pcStack_15e0 = (code *)&pcStack_1178;
  cache = (VMEMcache *)vmemcache_new();
  pcStack_1608 = (code *)0x1062a2;
  vmemcache_set_size(cache,0x100000);
  pcStack_1608 = (code *)0x1062af;
  vmemcache_set_extent_size(cache,0x100);
  pcStack_1608 = (code *)0x1062ba;
  vmemcache_set_eviction_policy(cache,pcVar23);
  pcStack_1608 = (code *)0x1062c5;
  pVVar10 = (VMEMcache *)ppuVar24;
  pVVar7 = cache;
  iVar2 = vmemcache_add();
  uVar15 = SUB84(pVVar10,0);
  if (iVar2 != 0) goto LAB_001063c5;
  __s1 = (char *)0x0;
  sVar17 = 0;
  pcStack_1608 = (code *)0x1062da;
  verify_stat_entries(cache,0);
  pcStack_1608 = (code *)0x1062e2;
  verify_heap_entries(cache,sVar17);
  ppuVar24 = &PTR_anon_var_dwarf_5a6_0010bda0;
  pcVar23 = "VALUE";
  do {
    uVar13 = *(undefined8 *)(__s1 + 0x10bda0);
    pcStack_1608 = (code *)0x10630a;
    pVVar7 = cache;
    iVar2 = vmemcache_put(cache,uVar13,6,"VALUE",6);
    uVar15 = (undefined4)uVar13;
    if (iVar2 != 0) {
      pcStack_1608 = (code *)0x1063c0;
      test_merge_allocations_cold_2();
      goto LAB_001063c0;
    }
    __s1 = __s1 + 8;
  } while (__s1 != (char *)0x28);
  sVar17 = 5;
  pcStack_1608 = (code *)0x106329;
  verify_stat_entries(cache,5);
  pcStack_1608 = (code *)0x106331;
  verify_heap_entries(cache,sVar17);
  pcVar23 = (char *)0x0;
  __s1 = "\x01";
  do {
    puVar18 = (&PTR_anon_var_dwarf_5a6_0010bda0)[*(uint *)((long)&DAT_00108cb0 + (long)pcVar23)];
    pcStack_1608 = (code *)0x106350;
    pVVar7 = cache;
    iVar2 = vmemcache_evict(cache,puVar18,6);
    uVar15 = SUB84(puVar18,0);
    if (iVar2 == -1) goto LAB_001063c0;
    pcVar23 = pcVar23 + 4;
  } while (pcVar23 != (char *)0x14);
  sVar17 = 0;
  pcStack_1608 = (code *)0x106369;
  verify_stat_entries(cache,0);
  pcStack_1608 = (code *)0x106371;
  verify_heap_entries(cache,sVar17);
  uVar15 = 0x108a47;
  pcStack_1608 = (code *)0x106392;
  pVVar7 = cache;
  iVar2 = vmemcache_put(cache,"KEY_1",6,"VALUE",6);
  if (iVar2 == 0) {
    sVar17 = 1;
    pcStack_1608 = (code *)0x1063a3;
    verify_stat_entries(cache,1);
    pcStack_1608 = (code *)0x1063ab;
    verify_heap_entries(cache,sVar17);
    vmemcache_delete(cache);
    return;
  }
  goto LAB_001063ca;
LAB_001063c0:
  pcStack_1608 = (code *)0x1063c5;
  test_merge_allocations_cold_4();
LAB_001063c5:
  pcStack_1608 = (code *)0x1063ca;
  test_merge_allocations_cold_1();
LAB_001063ca:
  pcStack_1608 = test_offsets;
  test_merge_allocations_cold_3();
  pcVar14 = auStack_18b8;
  apuStack_1848[0] = auStack_1878;
  apuStack_1848[1] = (undefined1 *)0x20;
  alStack_1838[0] = 0;
  alStack_1838[1] = 0x20;
  uStack_1820 = 0x20;
  uStack_1818 = 2;
  uStack_1810 = 0x1e;
  uStack_1800 = 0x20;
  uStack_17f8 = 0x1f;
  uStack_17f0 = 1;
  uStack_17e0 = 0x20;
  uStack_17d8 = 0x20;
  uStack_17d0 = 0;
  uStack_17c0 = 0x20;
  uStack_17b8 = 0x21;
  uStack_17b0 = 0;
  puStack_17a8 = auStack_18b8;
  uStack_17a0 = 0x40;
  uStack_1798 = 0;
  uStack_1790 = 0x20;
  uStack_1780 = 0x40;
  uStack_1778 = 4;
  uStack_1770 = 0x1c;
  uStack_1760 = 0x40;
  uStack_1758 = 0x1f;
  uStack_1750 = 1;
  uStack_1740 = 0x40;
  uStack_1738 = 0x20;
  uStack_1730 = 0;
  uStack_1720 = 0x40;
  uStack_1718 = 0x21;
  uStack_1710 = 0;
  puStack_1708 = auStack_1858;
  uStack_1700 = 0x10;
  uStack_16f8 = 0;
  uStack_16f0 = 0x10;
  uStack_16e0 = 0x10;
  uStack_16d8 = 2;
  uStack_16d0 = 0x10;
  uStack_16c0 = 0x10;
  uStack_16b8 = 0x10;
  uStack_16b0 = 0x10;
  uStack_16a0 = 0x10;
  uStack_1698 = 0x12;
  uStack_1690 = 0xe;
  uStack_1680 = 0x10;
  uStack_1678 = 0x20;
  uStack_1670 = 0;
  uStack_1660 = 0x10;
  uStack_1658 = 0x21;
  uStack_1650 = 0;
  uStack_18c0 = 0x1065e7;
  puStack_1828 = apuStack_1848[0];
  puStack_1808 = apuStack_1848[0];
  puStack_17e8 = apuStack_1848[0];
  puStack_17c8 = apuStack_1848[0];
  puStack_1788 = puStack_17a8;
  puStack_1768 = puStack_17a8;
  puStack_1748 = puStack_17a8;
  puStack_1728 = puStack_17a8;
  puStack_16e8 = puStack_1708;
  puStack_16c8 = puStack_1708;
  puStack_16a8 = puStack_1708;
  puStack_1688 = puStack_1708;
  puStack_1668 = puStack_1708;
  pVStack_1630 = cache;
  pcStack_1628 = __s1;
  sStack_1620 = unaff_R13;
  pcStack_1618 = pcVar23;
  pVStack_1610 = (VMEMcache *)ppuVar24;
  pcStack_1608 = (code *)&pcStack_15e0;
  pvVar11 = (void *)vmemcache_new();
  uStack_18c0 = 0x1065f7;
  vmemcache_set_size(pvVar11,0x100000);
  uStack_18c0 = 0x106604;
  vmemcache_set_extent_size(pvVar11,0x100);
  uStack_18c0 = 0x10660f;
  vmemcache_set_eviction_policy(pvVar11,uVar15);
  uStack_18c0 = 0x10661a;
  pvVar19 = pvVar11;
  iVar2 = vmemcache_add(pvVar11,pVVar7);
  if (iVar2 == 0) {
    pcVar14 = acStack_18d8;
    lVar8 = 0;
    auVar25 = _DAT_00108030;
    auVar27 = _DAT_00108040;
    auVar28 = _DAT_00108050;
    auVar29 = _DAT_00108060;
    auVar30 = _DAT_00108070;
    auVar31 = _DAT_00108080;
    auVar32 = _DAT_00108090;
    auVar33 = _DAT_001080a0;
    do {
      auVar34 = auVar33 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar43._4_4_ = iVar2;
      auVar43._0_4_ = iVar2;
      auVar43._8_4_ = iVar4;
      auVar43._12_4_ = iVar4;
      auVar51._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar51._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar51._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar51._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar35._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar35._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar35._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar35._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar35 = auVar35 & auVar51;
      auVar34 = pshuflw(auVar43,auVar35,0xe8);
      auVar34 = packssdw(auVar34,auVar34);
      cVar1 = (char)lVar8;
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8] = cVar1 + 'a';
      }
      auVar34 = packssdw(auVar35,auVar35);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 1] = cVar1 + 'b';
      }
      auVar34 = auVar32 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar44._4_4_ = iVar2;
      auVar44._0_4_ = iVar2;
      auVar44._8_4_ = iVar4;
      auVar44._12_4_ = iVar4;
      auVar52._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar52._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar52._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar52._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar36._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar36._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar36._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar36._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar36 = auVar36 & auVar52;
      auVar34 = packssdw(auVar44,auVar36);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
        acStack_18d8[lVar8 + 2] = cVar1 + 'c';
      }
      auVar34 = pshufhw(auVar36,auVar36,0x84);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
        acStack_18d8[lVar8 + 3] = cVar1 + 'd';
      }
      auVar34 = auVar31 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar45._4_4_ = iVar2;
      auVar45._0_4_ = iVar2;
      auVar45._8_4_ = iVar4;
      auVar45._12_4_ = iVar4;
      auVar53._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar53._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar53._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar53._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar37._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar37._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar37._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar37._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar37 = auVar37 & auVar53;
      auVar34 = pshuflw(auVar45,auVar37,0xe8);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 4] = cVar1 + 'e';
      }
      auVar34 = packssdw(auVar37,auVar37);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._4_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 5] = cVar1 + 'f';
      }
      auVar34 = auVar30 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar46._4_4_ = iVar2;
      auVar46._0_4_ = iVar2;
      auVar46._8_4_ = iVar4;
      auVar46._12_4_ = iVar4;
      auVar54._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar54._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar54._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar54._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar38._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar38._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar38._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar38._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar38 = auVar38 & auVar54;
      auVar34 = packssdw(auVar46,auVar38);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 6] = cVar1 + 'g';
      }
      auVar34 = pshufhw(auVar38,auVar38,0x84);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._6_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 7] = cVar1 + 'h';
      }
      auVar34 = auVar29 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar47._4_4_ = iVar2;
      auVar47._0_4_ = iVar2;
      auVar47._8_4_ = iVar4;
      auVar47._12_4_ = iVar4;
      auVar55._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar55._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar55._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar55._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar39._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar39._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar39._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar39._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar39 = auVar39 & auVar55;
      auVar34 = pshuflw(auVar47,auVar39,0xe8);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 8] = cVar1 + 'i';
      }
      auVar34 = packssdw(auVar39,auVar39);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._8_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 9] = cVar1 + 'j';
      }
      auVar34 = auVar28 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar48._4_4_ = iVar2;
      auVar48._0_4_ = iVar2;
      auVar48._8_4_ = iVar4;
      auVar48._12_4_ = iVar4;
      auVar56._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar56._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar56._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar56._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar40._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar40._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar40._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar40._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar40 = auVar40 & auVar56;
      auVar34 = packssdw(auVar48,auVar40);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 10] = cVar1 + 'k';
      }
      auVar34 = pshufhw(auVar40,auVar40,0x84);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._10_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 0xb] = cVar1 + 'l';
      }
      auVar34 = auVar27 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar49._4_4_ = iVar2;
      auVar49._0_4_ = iVar2;
      auVar49._8_4_ = iVar4;
      auVar49._12_4_ = iVar4;
      auVar57._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar57._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar57._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar57._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar41._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar41._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar41._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar41._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar41 = auVar41 & auVar57;
      auVar34 = pshuflw(auVar49,auVar41,0xe8);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 0xc] = cVar1 + 'm';
      }
      auVar34 = packssdw(auVar41,auVar41);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._12_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 0xd] = cVar1 + 'n';
      }
      auVar34 = auVar25 ^ _DAT_001080c0;
      iVar2 = auVar34._0_4_;
      iVar4 = auVar34._8_4_;
      auVar50._4_4_ = iVar2;
      auVar50._0_4_ = iVar2;
      auVar50._8_4_ = iVar4;
      auVar50._12_4_ = iVar4;
      auVar58._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar58._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar58._8_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar58._12_4_ = -(uint)(iVar4 < -0x7fffffe1);
      auVar42._0_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar42._4_4_ = -(uint)(auVar34._4_4_ == -0x80000000);
      auVar42._8_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar42._12_4_ = -(uint)(auVar34._12_4_ == -0x80000000);
      auVar42 = auVar42 & auVar58;
      auVar34 = packssdw(auVar50,auVar42);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_18d8[lVar8 + 0xe] = cVar1 + 'o';
      }
      auVar34 = pshufhw(auVar42,auVar42,0x84);
      auVar34 = packssdw(auVar34,auVar34);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._14_2_ >> 8 & 1) != 0) {
        acStack_18d8[lVar8 + 0xf] = cVar1 + 'p';
      }
      lVar8 = lVar8 + 0x10;
      lVar26 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 0x10;
      auVar33._8_8_ = lVar26 + 0x10;
      lVar26 = auVar32._8_8_;
      auVar32._0_8_ = auVar32._0_8_ + 0x10;
      auVar32._8_8_ = lVar26 + 0x10;
      lVar26 = auVar31._8_8_;
      auVar31._0_8_ = auVar31._0_8_ + 0x10;
      auVar31._8_8_ = lVar26 + 0x10;
      lVar26 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 0x10;
      auVar30._8_8_ = lVar26 + 0x10;
      lVar26 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 0x10;
      auVar29._8_8_ = lVar26 + 0x10;
      lVar26 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 0x10;
      auVar28._8_8_ = lVar26 + 0x10;
      lVar26 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 0x10;
      auVar27._8_8_ = lVar26 + 0x10;
      lVar26 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 0x10;
      auVar25._8_8_ = lVar26 + 0x10;
    } while (lVar8 != 0x20);
    pvVar19 = pvVar11;
    pcStack_1638 = pcVar14;
    iVar2 = vmemcache_put(pvVar11,"KEY",4,pcVar14,0x20);
    if (iVar2 == 0) {
      lVar8 = 0;
      pVVar7 = (VMEMcache *)&lStack_1640;
      while( true ) {
        sVar12 = vmemcache_get(pvVar11,"KEY",4,*(undefined8 *)((long)apuStack_1848 + lVar8),
                               *(undefined8 *)((long)apuStack_1848 + lVar8 + 8),
                               *(undefined8 *)((long)alStack_1838 + lVar8),pVVar7);
        sVar6 = *(size_t *)((long)alStack_1838 + lVar8 + 8);
        if (sVar12 != sVar6) break;
        if (lStack_1640 != 0x20) {
          test_offsets_cold_4();
          break;
        }
        if ((0 < (long)sVar6) &&
           (iVar2 = strncmp(*(char **)((long)apuStack_1848 + lVar8),
                            pcStack_1638 + *(long *)((long)alStack_1838 + lVar8),sVar6), iVar2 != 0)
           ) goto LAB_00106b2f;
        lVar8 = lVar8 + 0x20;
        if (lVar8 == 0x200) {
          vmemcache_delete(pvVar11);
          return;
        }
      }
      test_offsets_cold_3();
LAB_00106b2f:
      pvVar19 = (void *)((long)apuStack_1848 + lVar8);
      test_offsets_cold_5();
      goto LAB_00106b42;
    }
  }
  else {
LAB_00106b42:
    builtin_strncpy(pcVar14 + -8,"Gk\x10",4);
    pcVar14[-4] = '\0';
    pcVar14[-3] = '\0';
    pcVar14[-2] = '\0';
    pcVar14[-1] = '\0';
    test_offsets_cold_1();
  }
  *(code **)(pcVar14 + -8) = test_vmemcache_get_stat;
  test_offsets_cold_2();
  *(code ***)(pcVar14 + -8) = &pcStack_1608;
  *(VMEMcache **)(pcVar14 + -0x10) = pVVar7;
  pcVar23 = pcVar14 + -0x18;
  *(void **)(pcVar14 + -0x18) = pvVar11;
  pcVar14[-0x20] = '[';
  pcVar14[-0x1f] = 'k';
  pcVar14[-0x1e] = '\x10';
  pcVar14[-0x1d] = '\0';
  pcVar14[-0x1c] = '\0';
  pcVar14[-0x1b] = '\0';
  pcVar14[-0x1a] = '\0';
  pcVar14[-0x19] = '\0';
  uVar13 = vmemcache_new();
  pcVar14[-0x20] = 'k';
  pcVar14[-0x1f] = 'k';
  pcVar14[-0x1e] = '\x10';
  pcVar14[-0x1d] = '\0';
  pcVar14[-0x1c] = '\0';
  pcVar14[-0x1b] = '\0';
  pcVar14[-0x1a] = '\0';
  pcVar14[-0x19] = '\0';
  vmemcache_set_size(uVar13,0x100000);
  pcVar14[-0x20] = 'x';
  pcVar14[-0x1f] = 'k';
  pcVar14[-0x1e] = '\x10';
  pcVar14[-0x1d] = '\0';
  pcVar14[-0x1c] = '\0';
  pcVar14[-0x1b] = '\0';
  pcVar14[-0x1a] = '\0';
  pcVar14[-0x19] = '\0';
  vmemcache_set_extent_size(uVar13,0x100);
  pcVar14[-0x20] = -0x7d;
  pcVar14[-0x1f] = 'k';
  pcVar14[-0x1e] = '\x10';
  pcVar14[-0x1d] = '\0';
  pcVar14[-0x1c] = '\0';
  pcVar14[-0x1b] = '\0';
  pcVar14[-0x1a] = '\0';
  pcVar14[-0x19] = '\0';
  pvVar11 = pvVar19;
  iVar2 = vmemcache_add(uVar13);
  if (iVar2 == 0) {
    pcVar23 = pcVar14 + -0x28;
    pvVar11 = (void *)0x0;
    pcVar14[-0x30] = -0x62;
    pcVar14[-0x2f] = 'k';
    pcVar14[-0x2e] = '\x10';
    pcVar14[-0x2d] = '\0';
    pcVar14[-0x2c] = '\0';
    pcVar14[-0x2b] = '\0';
    pcVar14[-0x2a] = '\0';
    pcVar14[-0x29] = '\0';
    iVar2 = vmemcache_get_stat(uVar13,0,pcVar23,9);
    if (iVar2 != 0) {
      pcVar14[-0x30] = -0x59;
      pcVar14[-0x2f] = 'k';
      pcVar14[-0x2e] = '\x10';
      pcVar14[-0x2d] = '\0';
      pcVar14[-0x2c] = '\0';
      pcVar14[-0x2b] = '\0';
      pcVar14[-0x2a] = '\0';
      pcVar14[-0x29] = '\0';
      piVar9 = __errno_location();
      if (*piVar9 == 0x16) {
        pcVar14[-0x30] = -0x4c;
        pcVar14[-0x2f] = 'k';
        pcVar14[-0x2e] = '\x10';
        pcVar14[-0x2d] = '\0';
        pcVar14[-0x2c] = '\0';
        pcVar14[-0x2b] = '\0';
        pcVar14[-0x2a] = '\0';
        pcVar14[-0x29] = '\0';
        vmemcache_delete(uVar13);
        return;
      }
      goto LAB_00106bc7;
    }
  }
  else {
    pcVar14[-0x20] = -0x3e;
    pcVar14[-0x1f] = 'k';
    pcVar14[-0x1e] = '\x10';
    pcVar14[-0x1d] = '\0';
    pcVar14[-0x1c] = '\0';
    pcVar14[-0x1b] = '\0';
    pcVar14[-0x1a] = '\0';
    pcVar14[-0x19] = '\0';
    test_vmemcache_get_stat_cold_1();
  }
  pcVar23[-8] = -0x39;
  pcVar23[-7] = 'k';
  pcVar23[-6] = '\x10';
  pcVar23[-5] = '\0';
  pcVar23[-4] = '\0';
  pcVar23[-3] = '\0';
  pcVar23[-2] = '\0';
  pcVar23[-1] = '\0';
  test_vmemcache_get_stat_cold_3();
LAB_00106bc7:
  *(code **)(pcVar23 + -8) = verify_stat_entries;
  test_vmemcache_get_stat_cold_2();
  *(char **)(pcVar23 + -8) = pcVar14 + -8;
  *(undefined8 *)(pcVar23 + -0x10) = uVar13;
  *(undefined8 *)(pcVar23 + -0x18) = extraout_RAX;
  __dest = (void *)0x8;
  pcVar23[-0x20] = -0x15;
  pcVar23[-0x1f] = 'k';
  pcVar23[-0x1e] = '\x10';
  pcVar23[-0x1d] = '\0';
  pcVar23[-0x1c] = '\0';
  pcVar23[-0x1b] = '\0';
  pcVar23[-0x1a] = '\0';
  pcVar23[-0x19] = '\0';
  iVar2 = vmemcache_get_stat();
  if (iVar2 == -1) {
    builtin_strncpy(pcVar23 + -0x20,"\x02l\x10",4);
    pcVar23[-0x1c] = '\0';
    pcVar23[-0x1b] = '\0';
    pcVar23[-0x1a] = '\0';
    pcVar23[-0x19] = '\0';
    verify_stat_entries_cold_2();
  }
  else if (*(void **)(pcVar23 + -0x18) == pvVar11) {
    return;
  }
  *(code **)(pcVar23 + -0x20) = on_evict_test_evict_cb;
  __src = pvVar11;
  verify_stat_entries_cold_1();
  *(char **)(pcVar23 + -0x20) = pcVar23 + -8;
  *(long *)((long)__dest + 0x118) = *(long *)((long)__dest + 0x118) + 1;
  *(long *)(pcVar23 + -0x30) = (long)__dest + 0x108;
  pcVar23[-0x38] = '7';
  pcVar23[-0x37] = 'l';
  pcVar23[-0x36] = '\x10';
  pcVar23[-0x35] = '\0';
  pcVar23[-0x34] = '\0';
  pcVar23[-0x33] = '\0';
  pcVar23[-0x32] = '\0';
  pcVar23[-0x31] = '\0';
  lVar8 = vmemcache_get();
  if (lVar8 < 0) {
    builtin_strncpy(pcVar23 + -0x38,"Ol\x10",4);
    pcVar23[-0x34] = '\0';
    pcVar23[-0x33] = '\0';
    pcVar23[-0x32] = '\0';
    pcVar23[-0x31] = '\0';
    on_evict_test_evict_cb_cold_2();
  }
  else if (lVar8 == 0x100) {
    return;
  }
  *(code **)(pcVar23 + -0x38) = on_miss_test_evict_cb;
  on_evict_test_evict_cb_cold_1();
  *(char **)(pcVar23 + -0x38) = pcVar23 + -0x20;
  *(void **)(pcVar23 + -0x40) = pvVar19;
  *(void **)(pcVar23 + -0x48) = pvVar11;
  *(long *)((long)__dest + 0x110) = *(long *)((long)__dest + 0x110) + 1;
  uVar16 = extraout_RDX;
  if (*(ulong *)((long)__dest + 0x100) < extraout_RDX) {
    uVar16 = *(ulong *)((long)__dest + 0x100);
  }
  pcVar23[-0x50] = -0x7c;
  pcVar23[-0x4f] = 'l';
  pcVar23[-0x4e] = '\x10';
  pcVar23[-0x4d] = '\0';
  pcVar23[-0x4c] = '\0';
  pcVar23[-0x4b] = '\0';
  pcVar23[-0x4a] = '\0';
  pcVar23[-0x49] = '\0';
  memcpy(__dest,__src,uVar16);
  *(ulong *)((long)__dest + 0x108) = uVar16;
  return;
}

Assistant:

static void
test_new_delete(const char *dir, const char *file, enum vmemcache_repl_p repl_p)
{
	VMEMcache *cache;

	/* TEST #1 - minimum values of max_size and extent_size */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #2 - extent_size = max_size = VMEMCACHE_MIN_POOL */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #3 - extent_size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, 1))
		UT_FATAL(
			"vmemcache_set_extent_size did not fail with extent_size == 1");

	vmemcache_delete(cache);

	/* TEST #4 - extent_size == -1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, (size_t)-1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL("vmemcache_new did not fail with extent_size == -1");
	}
	vmemcache_delete(cache);

	/* TEST #5 - extent_size == VMEMCACHE_MIN_EXTENT - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT - 1))
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1");
	vmemcache_delete(cache);

	/* TEST #6 - extent_size == max_size + 1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL + 1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == max_size + 1");
	}
	vmemcache_delete(cache);

	/* TEST #7 - size == VMEMCACHE_MIN_POOL - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, VMEMCACHE_MIN_POOL - 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1");
	vmemcache_delete(cache);

	/* TEST #8 - size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == 1");
	vmemcache_delete(cache);

	/* TEST #9 - size == -1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, (size_t)-1))
		UT_FATAL(
			"vmemcache_new did not fail with size == -1");
	vmemcache_delete(cache);

	/* TEST #10 - not a directory, but a file */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, file))
		UT_FATAL(
			"vmemcache_new did not fail with a file instead of a directory");

#define ERR_MSG_1 "open: Not a directory"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_1))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_1"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #11 - NULL directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, NULL))
		UT_FATAL(
			"vmemcache_new did not fail with a NULL directory path");

#define ERR_MSG_2 "invalid (NULL) path"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_2))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_2"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #12 - nonexistent directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	char nonexistent[PATH_MAX];
	strcpy(nonexistent, dir);
	strcat(nonexistent, "/nonexistent_dir");
	if (!vmemcache_add(cache, nonexistent))
		UT_FATAL(
			"vmemcache_new did not fail with a nonexistent directory path");
	vmemcache_delete(cache);
}